

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteOsOpen(unqlite_vfs *pVfs,SyMemBackend *pAlloc,char *zPath,unqlite_file **ppOut,uint flags
                 )

{
  unqlite_file *puStack_40;
  int rc;
  unqlite_file *pFile;
  uint flags_local;
  unqlite_file **ppOut_local;
  char *zPath_local;
  SyMemBackend *pAlloc_local;
  unqlite_vfs *pVfs_local;
  
  *ppOut = (unqlite_file *)0x0;
  if (zPath == (char *)0x0) {
    pVfs_local._4_4_ = -3;
  }
  else {
    puStack_40 = (unqlite_file *)SyMemBackendAlloc(pAlloc,pVfs->szOsFile + 8);
    if (puStack_40 == (unqlite_file *)0x0) {
      pVfs_local._4_4_ = -1;
    }
    else {
      SyZero(puStack_40,pVfs->szOsFile + 8);
      pVfs_local._4_4_ = (*pVfs->xOpen)(pVfs,zPath,puStack_40,flags);
      if (pVfs_local._4_4_ != 0) {
        SyMemBackendFree(pAlloc,puStack_40);
        puStack_40 = (unqlite_file *)0x0;
      }
      *ppOut = puStack_40;
    }
  }
  return pVfs_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE int unqliteOsOpen(
  unqlite_vfs *pVfs,
  SyMemBackend *pAlloc,
  const char *zPath, 
  unqlite_file **ppOut, 
  unsigned int flags 
)
{
	unqlite_file *pFile;
	int rc;
	*ppOut = 0;
	if( zPath == 0 ){
		/* May happen if dealing with an in-memory database */
		return SXERR_EMPTY;
	}
	/* Allocate a new instance */
	pFile = (unqlite_file *)SyMemBackendAlloc(pAlloc,sizeof(unqlite_file)+pVfs->szOsFile);
	if( pFile == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pFile,sizeof(unqlite_file)+pVfs->szOsFile);
	/* Invoke the xOpen method of the underlying VFS */
	rc = pVfs->xOpen(pVfs, zPath, pFile, flags);
	if( rc != UNQLITE_OK ){
		SyMemBackendFree(pAlloc,pFile);
		pFile = 0;
	}
	*ppOut = pFile;
	return rc;
}